

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O3

void __thiscall wasm::StackIROptimizer::removeUnneededBlocks(StackIROptimizer *this)

{
  pointer ppSVar1;
  BranchSeeker *this_00;
  bool bVar2;
  char *in_RCX;
  StackInst **inst;
  pointer ppSVar3;
  Name target;
  
  ppSVar1 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->insts->
                 super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
    if ((*ppSVar3 != (StackInst *)0x0) &&
       (this_00 = (BranchSeeker *)(*ppSVar3)->origin,
       *(int *)&(this_00->
                super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                ).
                super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                .replacep == 1)) {
      target.super_IString.str._M_str = in_RCX;
      target.super_IString.str._M_len =
           (size_t)(this_00->
                   super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   ).
                   super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                   .stack.fixed._M_elems[0].currp;
      bVar2 = BranchUtils::BranchSeeker::has
                        (this_00,(Expression *)
                                 (this_00->
                                 super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 ).
                                 super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                                 .stack.fixed._M_elems[0].func,target);
      if (!bVar2) {
        *ppSVar3 = (StackInst *)0x0;
      }
    }
  }
  return;
}

Assistant:

void removeUnneededBlocks() {
    for (auto*& inst : insts) {
      if (!inst) {
        continue;
      }
      if (auto* block = inst->origin->dynCast<Block>()) {
        if (!BranchUtils::BranchSeeker::has(block, block->name)) {
          // TODO optimize, maybe run remove-unused-names
          inst = nullptr;
        }
      }
    }
  }